

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzysmp.cpp
# Opt level: O2

void __thiscall
TPZFYsmpMatrix<std::complex<float>_>::SolveSOR
          (TPZFYsmpMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *rhs,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *param_5,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  long *plVar1;
  complex<float> *__y;
  complex<float> *pcVar2;
  int64_t ir;
  long row;
  long lVar3;
  long lVar4;
  bool bVar5;
  float extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  complex<float> local_98;
  float local_90;
  float local_8c;
  long *local_88;
  long local_80;
  TPZFMatrix<std::complex<float>_> *local_78;
  float local_70 [2];
  undefined8 local_68;
  long local_50;
  long local_48;
  long local_40;
  complex<float> local_38;
  
  lVar3 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  bVar5 = -1 < direction;
  local_50 = 0;
  if (!bVar5) {
    local_50 = lVar3 + -1;
  }
  local_40 = -1;
  if (bVar5) {
    local_40 = lVar3;
  }
  local_88 = numiterations;
  local_78 = rhs;
  if (FromCurrent == 0) {
    local_68 = overrelax;
    (*(x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(x);
    overrelax = local_68;
  }
  local_90 = (float)(*tol + *tol);
  local_48 = (ulong)bVar5 * 2 + -1;
  local_8c = (float)overrelax;
  lVar3 = 0;
  while ((lVar3 < *local_88 && (row = local_50, *tol <= (double)local_90))) {
    for (; local_80 = lVar3, row != local_40; row = row + local_48) {
      local_98._M_value = local_78->fElem[row]._M_value;
      plVar1 = (this->fIA).fStore;
      lVar4 = plVar1[row];
      lVar3 = lVar4 * 8;
      for (; lVar4 < plVar1[row + 1]; lVar4 = lVar4 + 1) {
        pcVar2 = (this->fA).fStore;
        __y = TPZFMatrix<std::complex<float>_>::operator()
                        (x,*(int64_t *)((long)(this->fJA).fStore + lVar3),0);
        std::operator*((complex<float> *)((long)&pcVar2->_M_value + lVar3),__y);
        local_98._M_value =
             CONCAT44((float)(local_98._M_value >> 0x20) - extraout_XMM0_Db,
                      (float)local_98._M_value - extraout_XMM0_Da);
        plVar1 = (this->fIA).fStore;
        lVar3 = lVar3 + 8;
      }
      std::operator*(&local_98,&local_98);
      local_70[0] = local_8c;
      local_70[1] = 0.0;
      std::operator/(&local_98,(this->fDiag).fStore + row);
      std::operator*((complex<float> *)local_70,&local_38);
      local_68 = (REAL)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
      pcVar2 = TPZFMatrix<std::complex<float>_>::operator()(x,row,0);
      pcVar2->_M_value =
           CONCAT44((float)(pcVar2->_M_value >> 0x20) + local_68._4_4_,
                    (float)pcVar2->_M_value + (float)local_68);
      lVar3 = local_80;
    }
    if (local_90 < 0.0) {
      local_90 = sqrtf(local_90);
    }
    else {
      local_90 = SQRT(local_90);
    }
    lVar3 = local_80 + 1;
  }
  *tol = (double)local_90;
  *local_88 = lVar3;
  if (residual != (TPZFMatrix<std::complex<float>_> *)0x0) {
    (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x28])(this,x,local_78);
  }
  return;
}

Assistant:

void TPZFYsmpMatrix<TVar>::SolveSOR( int64_t &numiterations, const TPZFMatrix<TVar> &rhs, TPZFMatrix<TVar> &x,
							  TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &/*scratch*/,
							  const REAL overrelax, REAL &tol,
							  const int FromCurrent,const int direction ) {
	
	//    if(!fDiag) ComputeDiagonal();
	int64_t irStart = 0,irLast = this->Rows(),irInc = 1;
	if(direction < 0) {
		irStart = this->Rows()-1;
		irLast = -1;
		irInc = -1;
	}
	if(!FromCurrent) x.Zero();
	RTVar eqres = 2.*tol;
	int64_t iteration;
	for(iteration=0; iteration<numiterations && eqres >= tol; iteration++) {
		TVar local_eqres = 0.;
		int64_t ir=irStart;
		while(ir != irLast) {
			TVar xnewval=rhs.g(ir,0);
			for(int64_t ic=fIA[ir]; ic<fIA[ir+1]; ic++) {
				xnewval -= fA[ic] * x(fJA[ic],0);
			}
			local_eqres += xnewval*xnewval;
			x(ir,0) += (TVar)overrelax*(xnewval/fDiag[ir]);
			ir += irInc;
		}
		eqres = sqrt(eqres);
	}
	tol = eqres;
	numiterations = iteration;
	if(residual) this->Residual(x,rhs,*residual);
}